

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O0

int __thiscall SQLite::Statement::bind(Statement *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int iVar1;
  int extraout_EAX;
  sqlite3_stmt *pStmt;
  char *zData;
  int ret;
  string *aValue_local;
  int aIndex_local;
  Statement *this_local;
  
  pStmt = Ptr::operator_cast_to_sqlite3_stmt_(&this->mStmtPtr);
  zData = (char *)std::__cxx11::string::c_str();
  iVar1 = std::__cxx11::string::size();
  iVar1 = sqlite3_bind_text(pStmt,__fd,zData,iVar1,(_func_void_void_ptr *)0xffffffffffffffff);
  check(this,iVar1);
  return extraout_EAX;
}

Assistant:

void Statement::bind(const int aIndex, const std::string& aValue)
{
    const int ret = sqlite3_bind_text(mStmtPtr, aIndex, aValue.c_str(),
                                      static_cast<int>(aValue.size()), SQLITE_TRANSIENT);
    check(ret);
}